

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O3

SharedCalendar * __thiscall
icu_63::LocaleCacheKey<icu_63::SharedCalendar>::createObject
          (LocaleCacheKey<icu_63::SharedCalendar> *this,void *param_1,UErrorCode *status)

{
  Calendar *pCVar1;
  SharedCalendar *this_00;
  UErrorCode *size;
  
  size = status;
  pCVar1 = Calendar::makeInstance(&this->fLoc,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    this_00 = (SharedCalendar *)UMemory::operator_new((UMemory *)0x20,(size_t)size);
    if (this_00 != (SharedCalendar *)0x0) {
      (this_00->super_SharedObject).softRefCount = 0;
      (this_00->super_SharedObject).hardRefCount = (__atomic_base<int>)0x0;
      (this_00->super_SharedObject).cachePtr = (UnifiedCacheBase *)0x0;
      (this_00->super_SharedObject).super_UObject._vptr_UObject =
           (_func_int **)&PTR__SharedCalendar_003d0c80;
      this_00->ptr = pCVar1;
      SharedObject::addRef((SharedObject *)this_00);
      return this_00;
    }
    if (pCVar1 != (Calendar *)0x0) {
      (*(pCVar1->super_UObject)._vptr_UObject[1])(pCVar1);
    }
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  return (SharedCalendar *)0x0;
}

Assistant:

U_I18N_API
const SharedCalendar *LocaleCacheKey<SharedCalendar>::createObject(
        const void * /*unusedCreationContext*/, UErrorCode &status) const {
    Calendar *calendar = Calendar::makeInstance(fLoc, status);
    if (U_FAILURE(status)) {
        return NULL;
    }
    SharedCalendar *shared = new SharedCalendar(calendar);
    if (shared == NULL) {
        delete calendar;
        status = U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    shared->addRef();
    return shared;
}